

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O3

bool absl::(anonymous_namespace)::Base64UnescapeInternal<std::__cxx11::string>
               (Nullable<const_char_*> src,size_t slen,
               Nonnull<std::__cxx11::basic_string<char>_*> dest,
               Nonnull<const_signed_char_*> unbase64)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pcVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  byte *pbVar18;
  byte *pbVar19;
  ulong local_40;
  
  uVar15 = slen - (slen >> 2);
  std::__cxx11::string::resize((ulong)dest,(char)uVar15);
  pcVar8 = (dest->_M_dataplus)._M_p;
  if (pcVar8 == (pointer)0x0) {
    if (3 < slen) {
      uVar4 = 0;
      bVar1 = 0;
      uVar5 = 0;
      uVar7 = 0;
LAB_002677a4:
      if (((((ulong)(byte)*src == 0) || ((ulong)((byte *)src)[1] == 0)) ||
          ((ulong)((byte *)src)[2] == 0)) ||
         (uVar4 = (int)unbase64[((byte *)src)[3]] |
                  (int)unbase64[((byte *)src)[2]] << 6 |
                  (int)unbase64[((byte *)src)[1]] << 0xc | (int)unbase64[(byte)*src] << 0x12,
         (int)uVar4 < 0)) {
        uVar6 = slen - 2;
        uVar13 = slen - 3;
        sVar12 = slen - 4;
        uVar14 = 0;
        uVar16 = slen;
        pbVar18 = (byte *)src;
LAB_0026781a:
        bVar1 = *pbVar18;
        uVar5 = (uint)unbase64[bVar1];
        if (unbase64[bVar1] < '\0') {
          uVar16 = uVar16 - 1;
          pbVar18 = pbVar18 + 1;
          if (((&ascii_internal::kPropertyBits)[bVar1] & 8) != 0) goto code_r0x0026783b;
          goto LAB_00267a05;
        }
        goto LAB_0026785c;
      }
      slen = slen - 4;
      pbVar18 = (byte *)src + 4;
      goto LAB_002678ff;
    }
  }
  else if (3 < slen) {
    bVar1 = 0;
    uVar5 = 0;
    local_40 = 0;
    uVar3 = 0;
LAB_002675e2:
    if (((((ulong)(byte)*src == 0) || ((ulong)((byte *)src)[1] == 0)) ||
        ((ulong)((byte *)src)[2] == 0)) ||
       (uVar3 = (int)unbase64[((byte *)src)[3]] |
                (int)unbase64[((byte *)src)[2]] << 6 |
                (int)unbase64[((byte *)src)[1]] << 0xc | (int)unbase64[(byte)*src] << 0x12,
       (int)uVar3 < 0)) {
      sVar12 = slen - 4;
      lVar17 = -2;
      uVar6 = 0;
      uVar16 = slen;
      pbVar18 = (byte *)src;
LAB_0026764e:
      bVar1 = *pbVar18;
      uVar11 = (uint)unbase64[bVar1];
      uVar7 = local_40;
      if ((int)uVar11 < 0) {
        uVar16 = uVar16 - 1;
        pbVar18 = pbVar18 + 1;
        if (((&ascii_internal::kPropertyBits)[bVar1] & 8) != 0) goto code_r0x00267670;
        goto LAB_002679f3;
      }
      goto LAB_002676a2;
    }
    uVar16 = slen - 4;
    pbVar18 = (byte *)src + 4;
    goto LAB_0026773e;
  }
  uVar9 = 0;
  uVar4 = 0;
  uVar16 = slen;
  pbVar18 = (byte *)src;
  uVar6 = 0;
LAB_00267933:
  while( true ) {
    do {
      do {
        uVar7 = uVar6;
        pbVar19 = pbVar18;
        sVar12 = uVar16;
        uVar6 = 0;
        while( true ) {
          uVar13 = uVar6;
          if (sVar12 == uVar13) {
            pbVar18 = pbVar19 + sVar12;
            lVar17 = 0;
            goto LAB_00267a7d;
          }
          uVar16 = (ulong)pbVar19[uVar13];
          if (-1 < unbase64[uVar16]) break;
          uVar6 = uVar13 + 1;
          if (((&ascii_internal::kPropertyBits)[uVar16] & 8) == 0) {
            pbVar18 = pbVar19 + uVar13;
            lVar17 = (sVar12 - (uVar13 + 1)) + 1;
            if ((uVar16 == 0x2e) || (pbVar19[uVar13] == 0x3d)) goto LAB_00267a7d;
            goto switchD_00267a96_caseD_1;
          }
        }
        uVar5 = uVar4 << 6;
        uVar3 = (int)unbase64[uVar16] | uVar5;
        uVar9 = uVar9 + 1;
        uVar16 = ~uVar13 + sVar12;
        pbVar18 = pbVar19 + uVar13 + 1;
        uVar4 = uVar3;
        uVar6 = uVar7;
      } while (uVar9 != 4);
      uVar6 = uVar7 + 3;
      uVar16 = ~uVar13 + sVar12;
      uVar4 = 0;
      pbVar18 = pbVar19 + uVar13 + 1;
      uVar9 = 0;
    } while (pcVar8 == (pointer)0x0);
    if (uVar15 < uVar6) break;
    pcVar8[uVar7 + 2] = (char)uVar3;
    pcVar8[uVar7 + 1] = (char)(uVar5 >> 8);
    pcVar8[uVar7] = (char)(uVar5 >> 0x10);
    uVar4 = 0;
    uVar9 = 0;
  }
switchD_00267a96_caseD_1:
  dest->_M_string_length = 0;
  pcVar8 = (dest->_M_dataplus)._M_p;
  bVar2 = false;
LAB_00267b3a:
  *pcVar8 = '\0';
  return bVar2;
code_r0x0026783b:
  uVar14 = uVar14 + 1;
  uVar6 = uVar6 - 1;
  uVar13 = uVar13 - 1;
  sVar12 = sVar12 - 1;
  if (uVar16 < 4) {
LAB_00267a05:
    uVar9 = 0;
    goto LAB_00267a55;
  }
  goto LAB_0026781a;
LAB_0026785c:
  uVar16 = uVar14;
  bVar1 = ((byte *)src)[uVar16 + 1];
  if (unbase64[bVar1] < '\0') {
    if (((&ascii_internal::kPropertyBits)[bVar1] & 8) != 0) goto code_r0x0026787c;
    goto LAB_00267a2f;
  }
  pbVar18 = (byte *)src + uVar16 + 2;
  while( true ) {
    uVar16 = uVar13;
    bVar1 = *pbVar18;
    pbVar18 = pbVar18 + 1;
    if (-1 < unbase64[bVar1]) break;
    if ((((&ascii_internal::kPropertyBits)[bVar1] & 8) == 0) ||
       (sVar12 = sVar12 - 1, uVar13 = uVar16 - 1, uVar16 < 2)) {
      uVar9 = 2;
      uVar5 = (int)unbase64[bVar1];
      goto LAB_00267a55;
    }
  }
  while( true ) {
    slen = sVar12;
    bVar1 = *pbVar18;
    pbVar18 = pbVar18 + 1;
    uVar5 = (uint)unbase64[bVar1];
    if (-1 < unbase64[bVar1]) break;
    if ((((&ascii_internal::kPropertyBits)[bVar1] & 8) == 0) || (sVar12 = slen - 1, slen == 0)) {
      uVar9 = 3;
      uVar16 = slen;
      goto LAB_00267a55;
    }
  }
LAB_002678ff:
  uVar7 = uVar7 + 3;
  uVar9 = 0;
  uVar16 = slen;
  src = (Nullable<const_char_*>)pbVar18;
  if (slen < 4) goto LAB_00267a55;
  goto LAB_002677a4;
code_r0x0026787c:
  uVar13 = uVar13 - 1;
  sVar12 = sVar12 - 1;
  bVar2 = uVar6 < 3;
  uVar6 = uVar6 - 1;
  uVar14 = uVar16 + 1;
  if (bVar2) {
LAB_00267a2f:
    pbVar18 = (byte *)src + uVar16 + 2;
    uVar9 = 1;
    uVar16 = ~(uVar16 + 1) + slen;
    uVar5 = (int)unbase64[bVar1];
    goto LAB_00267a55;
  }
  goto LAB_0026785c;
code_r0x00267670:
  uVar6 = uVar6 + 1;
  lVar17 = lVar17 + -1;
  sVar12 = sVar12 - 1;
  if (uVar16 < 4) {
LAB_002679f3:
    uVar9 = 0;
    uVar4 = uVar3;
    uVar5 = uVar11;
    goto LAB_00267a55;
  }
  goto LAB_0026764e;
LAB_002676a2:
  uVar13 = uVar6;
  uVar16 = slen + lVar17;
  bVar1 = ((byte *)src)[uVar13 + 1];
  uVar5 = (uint)unbase64[bVar1];
  if (unbase64[bVar1] < '\0') {
    if (((&ascii_internal::kPropertyBits)[bVar1] & 8) != 0) goto code_r0x00267692;
    goto LAB_00267a14;
  }
  uVar4 = uVar11 << 6 | uVar5;
  pbVar18 = (byte *)src + uVar13 + 2;
  while( true ) {
    bVar1 = *pbVar18;
    pbVar18 = pbVar18 + 1;
    uVar5 = (uint)unbase64[bVar1];
    if (-1 < unbase64[bVar1]) break;
    uVar16 = uVar16 - 1;
    if ((((&ascii_internal::kPropertyBits)[bVar1] & 8) == 0) || (sVar12 = sVar12 - 1, uVar16 < 2)) {
      uVar9 = 2;
      goto LAB_00267a55;
    }
  }
  uVar4 = uVar4 << 6 | uVar5;
  while( true ) {
    uVar16 = sVar12;
    bVar1 = *pbVar18;
    pbVar18 = pbVar18 + 1;
    uVar5 = (uint)unbase64[bVar1];
    if (-1 < unbase64[bVar1]) break;
    if ((((&ascii_internal::kPropertyBits)[bVar1] & 8) == 0) || (sVar12 = uVar16 - 1, uVar16 == 0))
    {
      uVar9 = 3;
      goto LAB_00267a55;
    }
  }
  uVar3 = uVar4 << 6 | uVar5;
LAB_0026773e:
  uVar7 = local_40 + 3;
  if (uVar15 < uVar7) goto switchD_00267a96_caseD_1;
  *(ushort *)(pcVar8 + local_40 + 1) = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
  uVar4 = uVar3 >> 0x10;
  pcVar8[local_40] = (char)(uVar3 >> 0x10);
  uVar9 = 0;
  slen = uVar16;
  src = (Nullable<const_char_*>)pbVar18;
  uVar3 = uVar4;
  local_40 = uVar7;
  if (uVar16 < 4) goto LAB_00267a55;
  goto LAB_002675e2;
code_r0x00267692:
  lVar17 = lVar17 + -1;
  sVar12 = sVar12 - 1;
  uVar6 = uVar13 + 1;
  if (uVar16 < 3) {
LAB_00267a14:
    pbVar18 = (byte *)src + uVar13 + 2;
    uVar16 = slen + ~(uVar13 + 1);
    uVar9 = 1;
    uVar4 = uVar11;
    goto LAB_00267a55;
  }
  goto LAB_002676a2;
LAB_00267a55:
  if ((int)uVar5 < 0) {
    if ((bVar1 == 0x2e) || (bVar1 == 0x3d)) goto LAB_00267a77;
    if (((&ascii_internal::kPropertyBits)[bVar1] & 8) != 0) goto LAB_00267a5c;
  }
  else {
LAB_00267a5c:
    if ((bVar1 != 0x3d) && (uVar6 = uVar7, bVar1 != 0x2e)) goto LAB_00267933;
LAB_00267a77:
    lVar17 = uVar16 + 1;
    pbVar18 = pbVar18 + -1;
LAB_00267a7d:
    switch(uVar9) {
    case 0:
      uVar5 = 0xffffffff;
      uVar6 = uVar7;
      break;
    case 1:
      goto switchD_00267a96_caseD_1;
    case 2:
      uVar6 = uVar7 + 1;
      uVar5 = 0xfffffffd;
      if (pcVar8 != (pointer)0x0) {
        if (uVar15 < uVar6) goto switchD_00267a96_caseD_1;
        pcVar8[uVar7] = (char)(uVar4 >> 4);
      }
      break;
    case 3:
      uVar6 = uVar7 + 2;
      uVar5 = 0xfffffffe;
      if (pcVar8 != (pointer)0x0) {
        if (uVar15 < uVar6) goto switchD_00267a96_caseD_1;
        pcVar8[uVar7 + 1] = (char)(uVar4 >> 2);
        pcVar8[uVar7] = (char)(uVar4 >> 10);
      }
      break;
    default:
      raw_log_internal::RawLog
                (kFatal,"escaping.cc",0x2ad,"This can\'t happen; base64 decoder state = %d",
                 (ulong)uVar9);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/escaping.cc"
                    ,0x2ad,
                    "bool absl::(anonymous namespace)::Base64UnescapeInternal(absl::Nullable<const char *>, size_t, absl::Nullable<char *>, size_t, absl::Nonnull<const signed char *>, absl::Nonnull<size_t *>)"
                   );
    }
    if (lVar17 == 0) {
      uVar4 = 0;
    }
    else {
      lVar10 = 0;
      uVar4 = 0;
      do {
        bVar1 = pbVar18[lVar10];
        if ((bVar1 == 0x3d) || (bVar1 == 0x2e)) {
          uVar4 = uVar4 + 1;
        }
        else if (((&ascii_internal::kPropertyBits)[bVar1] & 8) == 0) goto switchD_00267a96_caseD_1;
        lVar10 = lVar10 + 1;
      } while (lVar17 != lVar10);
    }
    if ((uVar4 & uVar5) == 0) {
      if (uVar15 < uVar6) {
        __assert_fail("len <= dest_len",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/escaping.cc"
                      ,0x341,
                      "bool absl::(anonymous namespace)::Base64UnescapeInternal(absl::Nullable<const char *>, size_t, absl::Nonnull<String *>, absl::Nonnull<const signed char *>) [String = std::basic_string<char>]"
                     );
      }
      if (dest->_M_string_length < uVar6) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
      }
      dest->_M_string_length = uVar6;
      pcVar8 = (dest->_M_dataplus)._M_p + uVar6;
      bVar2 = true;
      goto LAB_00267b3a;
    }
  }
  goto switchD_00267a96_caseD_1;
}

Assistant:

bool Base64UnescapeInternal(absl::Nullable<const char*> src, size_t slen,
                            absl::Nonnull<String*> dest,
                            absl::Nonnull<const signed char*> unbase64) {
  // Determine the size of the output string.  Base64 encodes every 3 bytes into
  // 4 characters.  Any leftover chars are added directly for good measure.
  const size_t dest_len = 3 * (slen / 4) + (slen % 4);

  strings_internal::STLStringResizeUninitialized(dest, dest_len);

  // We are getting the destination buffer by getting the beginning of the
  // string and converting it into a char *.
  size_t len;
  const bool ok =
      Base64UnescapeInternal(src, slen, &(*dest)[0], dest_len, unbase64, &len);
  if (!ok) {
    dest->clear();
    return false;
  }

  // could be shorter if there was padding
  assert(len <= dest_len);
  dest->erase(len);

  return true;
}